

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  int iVar20;
  undefined4 uVar21;
  size_t sVar22;
  undefined8 uVar23;
  Scene *pSVar24;
  Ref<embree::Geometry> *pRVar25;
  Geometry *pGVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar49;
  uint uVar50;
  int iVar51;
  undefined4 uVar52;
  AABBNodeMB4D *node1;
  ulong uVar53;
  RTCRayN *pRVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  undefined4 uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  size_t sVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  RayHitK<4> *pRVar73;
  long lVar74;
  ulong uVar75;
  float fVar76;
  float fVar108;
  float fVar110;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar77;
  float fVar109;
  float fVar113;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar97;
  float fVar111;
  float fVar114;
  undefined1 auVar98 [16];
  float fVar112;
  float fVar115;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar107;
  float fVar116;
  uint uVar117;
  uint uVar130;
  undefined1 auVar118 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar131;
  float fVar132;
  float fVar139;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar135;
  undefined1 auVar136 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar158;
  float fVar160;
  undefined1 auVar148 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar149;
  float fVar162;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar161;
  float fVar163;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar176;
  float fVar180;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar179;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar185;
  float fVar186;
  float fVar193;
  float fVar195;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar190;
  float fVar196;
  undefined1 auVar191 [16];
  float fVar194;
  undefined1 auVar192 [16];
  float fVar197;
  float fVar198;
  float fVar206;
  float fVar208;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar209;
  float fVar211;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar212;
  float fVar215;
  float fVar216;
  undefined1 auVar213 [16];
  float fVar217;
  undefined1 auVar214 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar245;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  float fVar247;
  float fVar251;
  float fVar252;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float local_13c8;
  float fStack_13c4;
  vbool<4> valid;
  undefined8 local_1368;
  undefined8 uStack_1360;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  RTCFilterFunctionNArguments args;
  undefined1 local_12e8 [12];
  float fStack_12dc;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a0;
  float fStack_129c;
  vfloat<4> tNear;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  StackItemT<embree::NodeRefPtr<4>_> *local_1158;
  size_t local_1150;
  RayHitK<4> *local_1148;
  long local_1140;
  ulong local_1138;
  ulong local_1130;
  Scene *scene;
  long local_1120;
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined4 local_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  uint local_1088;
  uint uStack_1084;
  uint uStack_1080;
  uint uStack_107c;
  uint local_1078;
  uint uStack_1074;
  uint uStack_1070;
  uint uStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1158 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_ff8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1008 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1018 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1028 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1038 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1068 = local_1028 * 0.99999964;
  local_1108 = local_1038 * 0.99999964;
  local_1058 = local_1048 * 0.99999964;
  local_1028 = local_1028 * 1.0000004;
  local_1038 = local_1038 * 1.0000004;
  local_1048 = local_1048 * 1.0000004;
  local_1160 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1168 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1170 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1130 = local_1168 ^ 0x10;
  local_1138 = local_1170 ^ 0x10;
  iVar51 = (tray->tnear).field_0.i[k];
  local_1118._4_4_ = iVar51;
  local_1118._0_4_ = iVar51;
  local_1118._8_4_ = iVar51;
  local_1118._12_4_ = iVar51;
  iVar51 = (tray->tfar).field_0.i[k];
  auVar202._4_4_ = iVar51;
  auVar202._0_4_ = iVar51;
  auVar202._8_4_ = iVar51;
  auVar202._12_4_ = iVar51;
  local_fd8 = mm_lookupmask_ps._0_8_;
  uStack_fd0 = mm_lookupmask_ps._8_8_;
  local_fe8 = mm_lookupmask_ps._240_8_;
  uStack_fe0 = mm_lookupmask_ps._248_8_;
  lVar56 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1148 = ray;
  local_1150 = k;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  local_1178 = local_1160 ^ 0x10;
  uVar67 = local_1160;
  uVar55 = local_1160 ^ 0x10;
  uVar57 = local_1170;
  uVar58 = local_1168;
  auVar87 = local_1118;
  fVar116 = local_1008;
  fVar246 = local_1008;
  fVar196 = local_1008;
  fVar144 = local_1008;
  fVar252 = local_1038;
  fVar146 = local_1038;
  fVar111 = local_1038;
  fVar112 = local_1038;
  fVar114 = local_1048;
  fVar115 = local_1048;
  fVar159 = local_1048;
  fVar167 = local_1048;
  fVar161 = local_1068;
  fVar179 = local_1068;
  fVar163 = local_1068;
  fVar186 = local_1068;
  fVar147 = local_1108;
  fVar194 = local_1108;
  fVar198 = local_1108;
  fVar207 = local_1108;
  fVar209 = local_ff8;
  fVar211 = local_ff8;
  fVar212 = local_ff8;
  fVar215 = local_ff8;
  fVar216 = local_1018;
  fVar217 = local_1018;
  fVar221 = local_1018;
  fVar222 = local_1018;
  fVar76 = local_1028;
  fVar77 = local_1028;
  fVar108 = local_1028;
  fVar109 = local_1028;
  fVar110 = local_1058;
  fVar113 = local_1058;
  fVar132 = local_1058;
  fVar131 = local_1058;
  do {
    do {
      do {
        if (local_1158 == stack) {
          return;
        }
        pSVar49 = local_1158 + -1;
        local_1158 = local_1158 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar49->dist &&
               (float)pSVar49->dist != *(float *)(ray + k * 4 + 0x80));
      sVar66 = (local_1158->ptr).ptr;
      do {
        if ((sVar66 & 8) == 0) {
          uVar53 = sVar66 & 0xfffffffffffffff0;
          fVar139 = *(float *)(ray + k * 4 + 0x70);
          pfVar17 = (float *)(uVar53 + 0x80 + uVar67);
          pfVar16 = (float *)(uVar53 + 0x20 + uVar67);
          auVar133._0_4_ = ((*pfVar17 * fVar139 + *pfVar16) - fVar209) * fVar161;
          auVar133._4_4_ = ((pfVar17[1] * fVar139 + pfVar16[1]) - fVar211) * fVar179;
          auVar133._8_4_ = ((pfVar17[2] * fVar139 + pfVar16[2]) - fVar212) * fVar163;
          auVar133._12_4_ = ((pfVar17[3] * fVar139 + pfVar16[3]) - fVar215) * fVar186;
          pfVar17 = (float *)(uVar53 + 0x80 + uVar58);
          pfVar16 = (float *)(uVar53 + 0x20 + uVar58);
          auVar133 = maxps(auVar87,auVar133);
          auVar200._0_4_ = ((*pfVar17 * fVar139 + *pfVar16) - fVar116) * fVar147;
          auVar200._4_4_ = ((pfVar17[1] * fVar139 + pfVar16[1]) - fVar246) * fVar194;
          auVar200._8_4_ = ((pfVar17[2] * fVar139 + pfVar16[2]) - fVar196) * fVar198;
          auVar200._12_4_ = ((pfVar17[3] * fVar139 + pfVar16[3]) - fVar144) * fVar207;
          pfVar17 = (float *)(uVar53 + 0x80 + uVar57);
          pfVar16 = (float *)(uVar53 + 0x20 + uVar57);
          auVar168._0_4_ = ((*pfVar17 * fVar139 + *pfVar16) - fVar216) * fVar110;
          auVar168._4_4_ = ((pfVar17[1] * fVar139 + pfVar16[1]) - fVar217) * fVar113;
          auVar168._8_4_ = ((pfVar17[2] * fVar139 + pfVar16[2]) - fVar221) * fVar132;
          auVar168._12_4_ = ((pfVar17[3] * fVar139 + pfVar16[3]) - fVar222) * fVar131;
          auVar168 = maxps(auVar200,auVar168);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar133,auVar168);
          pfVar18 = (float *)(uVar53 + 0x80 + uVar55);
          pfVar16 = (float *)(uVar53 + 0x20 + uVar55);
          pfVar19 = (float *)(uVar53 + 0x80 + local_1130);
          pfVar17 = (float *)(uVar53 + 0x20 + local_1130);
          auVar169._0_4_ = ((*pfVar18 * fVar139 + *pfVar16) - fVar209) * fVar76;
          auVar169._4_4_ = ((pfVar18[1] * fVar139 + pfVar16[1]) - fVar211) * fVar77;
          auVar169._8_4_ = ((pfVar18[2] * fVar139 + pfVar16[2]) - fVar212) * fVar108;
          auVar169._12_4_ = ((pfVar18[3] * fVar139 + pfVar16[3]) - fVar215) * fVar109;
          auVar187._0_4_ = ((*pfVar19 * fVar139 + *pfVar17) - fVar116) * fVar252;
          auVar187._4_4_ = ((pfVar19[1] * fVar139 + pfVar17[1]) - fVar246) * fVar146;
          auVar187._8_4_ = ((pfVar19[2] * fVar139 + pfVar17[2]) - fVar196) * fVar111;
          auVar187._12_4_ = ((pfVar19[3] * fVar139 + pfVar17[3]) - fVar144) * fVar112;
          pfVar17 = (float *)(uVar53 + 0x80 + local_1138);
          pfVar16 = (float *)(uVar53 + 0x20 + local_1138);
          auVar189._0_4_ = ((*pfVar17 * fVar139 + *pfVar16) - fVar216) * fVar114;
          auVar189._4_4_ = ((pfVar17[1] * fVar139 + pfVar16[1]) - fVar217) * fVar115;
          auVar189._8_4_ = ((pfVar17[2] * fVar139 + pfVar16[2]) - fVar221) * fVar159;
          auVar189._12_4_ = ((pfVar17[3] * fVar139 + pfVar16[3]) - fVar222) * fVar167;
          auVar168 = minps(auVar187,auVar189);
          auVar133 = minps(auVar202,auVar169);
          auVar133 = minps(auVar133,auVar168);
          if (((uint)sVar66 & 7) == 6) {
            bVar34 = (fVar139 < *(float *)(uVar53 + 0xf0) && *(float *)(uVar53 + 0xe0) <= fVar139)
                     && tNear.field_0._0_4_ <= auVar133._0_4_;
            bVar35 = (fVar139 < *(float *)(uVar53 + 0xf4) && *(float *)(uVar53 + 0xe4) <= fVar139)
                     && tNear.field_0._4_4_ <= auVar133._4_4_;
            bVar36 = (fVar139 < *(float *)(uVar53 + 0xf8) && *(float *)(uVar53 + 0xe8) <= fVar139)
                     && tNear.field_0._8_4_ <= auVar133._8_4_;
            bVar37 = (fVar139 < *(float *)(uVar53 + 0xfc) && *(float *)(uVar53 + 0xec) <= fVar139)
                     && tNear.field_0._12_4_ <= auVar133._12_4_;
          }
          else {
            bVar34 = tNear.field_0._0_4_ <= auVar133._0_4_;
            bVar35 = tNear.field_0._4_4_ <= auVar133._4_4_;
            bVar36 = tNear.field_0._8_4_ <= auVar133._8_4_;
            bVar37 = tNear.field_0._12_4_ <= auVar133._12_4_;
          }
          auVar78._0_4_ = (uint)bVar34 * -0x80000000;
          auVar78._4_4_ = (uint)bVar35 * -0x80000000;
          auVar78._8_4_ = (uint)bVar36 * -0x80000000;
          auVar78._12_4_ = (uint)bVar37 * -0x80000000;
          uVar61 = movmskps((int)bvh,auVar78);
          bvh = (BVH *)CONCAT44((int)((ulong)bvh >> 0x20),uVar61);
        }
        if ((sVar66 & 8) == 0) {
          if (bvh == (BVH *)0x0) {
            iVar51 = 4;
          }
          else {
            uVar53 = sVar66 & 0xfffffffffffffff0;
            lVar65 = 0;
            if (bvh != (BVH *)0x0) {
              for (; ((ulong)bvh >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
              }
            }
            iVar51 = 0;
            sVar66 = *(size_t *)(uVar53 + lVar65 * 8);
            uVar64 = (ulong)&bvh[-1].field_0x23f & (ulong)bvh;
            if (uVar64 != 0) {
              uVar50 = tNear.field_0.i[lVar65];
              lVar65 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              sVar22 = *(size_t *)(uVar53 + lVar65 * 8);
              uVar117 = tNear.field_0.i[lVar65];
              uVar64 = uVar64 - 1 & uVar64;
              if (uVar64 == 0) {
                if (uVar50 < uVar117) {
                  (local_1158->ptr).ptr = sVar22;
                  local_1158->dist = uVar117;
                  local_1158 = local_1158 + 1;
                }
                else {
                  (local_1158->ptr).ptr = sVar66;
                  local_1158->dist = uVar50;
                  sVar66 = sVar22;
                  local_1158 = local_1158 + 1;
                }
              }
              else {
                auVar134._8_4_ = uVar50;
                auVar134._0_8_ = sVar66;
                auVar134._12_4_ = 0;
                auVar170._8_4_ = uVar117;
                auVar170._0_8_ = sVar22;
                auVar170._12_4_ = 0;
                lVar65 = 0;
                if (uVar64 != 0) {
                  for (; (uVar64 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                  }
                }
                uVar23 = *(undefined8 *)(uVar53 + lVar65 * 8);
                iVar20 = tNear.field_0.i[lVar65];
                auVar148._8_4_ = iVar20;
                auVar148._0_8_ = uVar23;
                auVar148._12_4_ = 0;
                auVar79._8_4_ = -(uint)((int)uVar50 < (int)uVar117);
                uVar64 = uVar64 - 1 & uVar64;
                if (uVar64 == 0) {
                  auVar79._4_4_ = auVar79._8_4_;
                  auVar79._0_4_ = auVar79._8_4_;
                  auVar79._12_4_ = auVar79._8_4_;
                  auVar188._8_4_ = uVar117;
                  auVar188._0_8_ = sVar22;
                  auVar188._12_4_ = 0;
                  auVar189 = blendvps(auVar188,auVar134,auVar79);
                  auVar133 = blendvps(auVar134,auVar170,auVar79);
                  auVar80._8_4_ = -(uint)(auVar189._8_4_ < iVar20);
                  auVar80._4_4_ = auVar80._8_4_;
                  auVar80._0_4_ = auVar80._8_4_;
                  auVar80._12_4_ = auVar80._8_4_;
                  auVar171._8_4_ = iVar20;
                  auVar171._0_8_ = uVar23;
                  auVar171._12_4_ = 0;
                  auVar168 = blendvps(auVar171,auVar189,auVar80);
                  auVar189 = blendvps(auVar189,auVar148,auVar80);
                  auVar81._8_4_ = -(uint)(auVar133._8_4_ < auVar189._8_4_);
                  auVar81._4_4_ = auVar81._8_4_;
                  auVar81._0_4_ = auVar81._8_4_;
                  auVar81._12_4_ = auVar81._8_4_;
                  SVar149 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar189,auVar133,auVar81);
                  SVar135 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar133,auVar189,auVar81);
                  *local_1158 = SVar135;
                  local_1158[1] = SVar149;
                  sVar66 = auVar168._0_8_;
                  local_1158 = local_1158 + 2;
                }
                else {
                  lVar65 = 0;
                  if (uVar64 != 0) {
                    for (; (uVar64 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                    }
                  }
                  auVar87._4_4_ = auVar79._8_4_;
                  auVar87._0_4_ = auVar79._8_4_;
                  auVar87._8_4_ = auVar79._8_4_;
                  auVar87._12_4_ = auVar79._8_4_;
                  auVar189 = blendvps(auVar170,auVar134,auVar87);
                  auVar87 = blendvps(auVar134,auVar170,auVar87);
                  auVar199._8_4_ = tNear.field_0.i[lVar65];
                  auVar199._0_8_ = *(undefined8 *)(uVar53 + lVar65 * 8);
                  auVar199._12_4_ = 0;
                  auVar82._8_4_ = -(uint)(iVar20 < tNear.field_0.i[lVar65]);
                  auVar82._4_4_ = auVar82._8_4_;
                  auVar82._0_4_ = auVar82._8_4_;
                  auVar82._12_4_ = auVar82._8_4_;
                  auVar168 = blendvps(auVar199,auVar148,auVar82);
                  auVar133 = blendvps(auVar148,auVar199,auVar82);
                  auVar83._8_4_ = -(uint)(auVar87._8_4_ < auVar133._8_4_);
                  auVar83._4_4_ = auVar83._8_4_;
                  auVar83._0_4_ = auVar83._8_4_;
                  auVar83._12_4_ = auVar83._8_4_;
                  auVar200 = blendvps(auVar133,auVar87,auVar83);
                  SVar135 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar87,auVar133,auVar83);
                  auVar84._8_4_ = -(uint)(auVar189._8_4_ < auVar168._8_4_);
                  auVar84._4_4_ = auVar84._8_4_;
                  auVar84._0_4_ = auVar84._8_4_;
                  auVar84._12_4_ = auVar84._8_4_;
                  auVar87 = blendvps(auVar168,auVar189,auVar84);
                  auVar133 = blendvps(auVar189,auVar168,auVar84);
                  auVar85._8_4_ = -(uint)(auVar133._8_4_ < auVar200._8_4_);
                  auVar85._4_4_ = auVar85._8_4_;
                  auVar85._0_4_ = auVar85._8_4_;
                  auVar85._12_4_ = auVar85._8_4_;
                  SVar149 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar200,auVar133,auVar85);
                  SVar190 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar133,auVar200,auVar85);
                  *local_1158 = SVar135;
                  local_1158[1] = SVar190;
                  local_1158[2] = SVar149;
                  sVar66 = auVar87._0_8_;
                  local_1158 = local_1158 + 3;
                  auVar87 = local_1118;
                  fVar147 = local_1108;
                  fVar194 = fStack_1104;
                  fVar198 = fStack_1100;
                  fVar207 = fStack_10fc;
                }
              }
            }
          }
        }
        else {
          iVar51 = 6;
        }
      } while (iVar51 == 0);
    } while (iVar51 != 6);
    local_1140 = (ulong)((uint)sVar66 & 0xf) - 8;
    if (local_1140 != 0) {
      uVar67 = sVar66 & 0xfffffffffffffff0;
      local_1120 = 0;
      sVar66 = k;
      pRVar73 = ray;
      do {
        ray = local_1148;
        k = local_1150;
        lVar65 = local_1120 * 0x60;
        pSVar24 = context->scene;
        scene = pSVar24;
        pRVar25 = (pSVar24->geometries).items;
        pGVar26 = pRVar25[*(uint *)(uVar67 + 0x40 + lVar65)].ptr;
        fVar116 = (pGVar26->time_range).lower;
        fVar246 = ((*(float *)(pRVar73 + sVar66 * 4 + 0x70) - fVar116) /
                  ((pGVar26->time_range).upper - fVar116)) * pGVar26->fnumTimeSegments;
        auVar136 = roundss(ZEXT416((uint)fVar116),ZEXT416((uint)fVar246),9);
        fVar116 = pGVar26->fnumTimeSegments + -1.0;
        if (fVar116 <= auVar136._0_4_) {
          auVar136._0_4_ = fVar116;
        }
        fVar116 = 0.0;
        if (0.0 <= auVar136._0_4_) {
          fVar116 = auVar136._0_4_;
        }
        lVar68 = (long)(int)fVar116 * 0x38;
        lVar27 = *(long *)(*(long *)&pGVar26[2].numPrimitives + lVar68);
        uVar59 = (ulong)*(uint *)(uVar67 + 4 + lVar65);
        pfVar16 = (float *)(lVar27 + (ulong)*(uint *)(uVar67 + lVar65) * 4);
        uVar55 = (ulong)*(uint *)(uVar67 + 0x10 + lVar65);
        lVar60 = lVar27 + uVar55 * 4;
        uVar57 = (ulong)*(uint *)(uVar67 + 0x20 + lVar65);
        pfVar17 = (float *)(lVar27 + uVar57 * 4);
        fVar111 = *pfVar17;
        fVar112 = pfVar17[1];
        fVar114 = pfVar17[2];
        uVar58 = (ulong)*(uint *)(uVar67 + 0x30 + lVar65);
        puVar1 = (undefined8 *)(lVar27 + uVar58 * 4);
        uVar23 = *puVar1;
        lVar28 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x44 + lVar65)].ptr[2].numPrimitives;
        lVar29 = *(long *)(lVar28 + lVar68);
        pfVar17 = (float *)(lVar29 + uVar59 * 4);
        uVar53 = (ulong)*(uint *)(uVar67 + 0x14 + lVar65);
        lVar27 = lVar29 + uVar53 * 4;
        uVar50 = *(uint *)(uVar67 + 0x24 + lVar65);
        pfVar18 = (float *)(lVar29 + (ulong)uVar50 * 4);
        fVar115 = *pfVar18;
        fVar159 = pfVar18[1];
        fVar167 = pfVar18[2];
        uVar117 = *(uint *)(uVar67 + 0x34 + lVar65);
        pfVar18 = (float *)(lVar29 + (ulong)uVar117 * 4);
        lVar30 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x48 + lVar65)].ptr[2].numPrimitives;
        lVar31 = *(long *)(lVar30 + lVar68);
        uVar64 = (ulong)*(uint *)(uVar67 + 8 + lVar65);
        lVar29 = lVar31 + uVar64 * 4;
        uVar72 = (ulong)*(uint *)(uVar67 + 0x18 + lVar65);
        uVar70 = (ulong)*(uint *)(uVar67 + 0x28 + lVar65);
        lVar2 = lVar31 + uVar70 * 4;
        fVar161 = *(float *)(lVar2 + 4);
        fVar179 = *(float *)(lVar2 + 8);
        uVar63 = (ulong)*(uint *)(uVar67 + 0x38 + lVar65);
        pfVar19 = (float *)(lVar31 + uVar63 * 4);
        fVar246 = fVar246 - fVar116;
        lVar32 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x4c + lVar65)].ptr[2].numPrimitives;
        lVar33 = *(long *)(lVar32 + lVar68);
        uVar62 = (ulong)*(uint *)(uVar67 + 0xc + lVar65);
        lVar2 = lVar33 + uVar62 * 4;
        uVar71 = (ulong)*(uint *)(uVar67 + 0x1c + lVar65);
        uVar75 = (ulong)*(uint *)(uVar67 + 0x2c + lVar65);
        lVar68 = lVar33 + uVar75 * 4;
        fVar163 = *(float *)(lVar68 + 4);
        fVar186 = *(float *)(lVar68 + 8);
        uVar69 = (ulong)*(uint *)(uVar67 + 0x3c + lVar65);
        pfVar3 = (float *)(lVar33 + uVar69 * 4);
        lVar74 = (long)((int)fVar116 + 1) * 0x38;
        lVar68 = *(long *)(*(long *)&pGVar26[2].numPrimitives + lVar74);
        pfVar4 = (float *)(lVar68 + (ulong)*(uint *)(uVar67 + lVar65) * 4);
        local_13c8 = (float)uVar23;
        fStack_13c4 = (float)((ulong)uVar23 >> 0x20);
        lVar30 = *(long *)(lVar30 + lVar74);
        pfVar5 = (float *)(lVar30 + uVar64 * 4);
        lVar28 = *(long *)(lVar28 + lVar74);
        pfVar6 = (float *)(lVar28 + uVar59 * 4);
        lVar32 = *(long *)(lVar32 + lVar74);
        pfVar7 = (float *)(lVar32 + uVar62 * 4);
        pfVar8 = (float *)(lVar68 + uVar55 * 4);
        pfVar9 = (float *)(lVar30 + uVar72 * 4);
        pfVar10 = (float *)(lVar28 + uVar53 * 4);
        pfVar11 = (float *)(lVar32 + uVar71 * 4);
        pfVar12 = (float *)(lVar68 + uVar57 * 4);
        fVar147 = *pfVar12;
        fVar194 = pfVar12[1];
        fVar198 = pfVar12[2];
        pfVar12 = (float *)(lVar30 + uVar70 * 4);
        fVar207 = *pfVar12;
        fVar209 = pfVar12[1];
        fVar211 = pfVar12[2];
        pfVar12 = (float *)(lVar28 + (ulong)uVar50 * 4);
        fVar212 = *pfVar12;
        fVar215 = pfVar12[1];
        fVar216 = pfVar12[2];
        pfVar12 = (float *)(lVar32 + uVar75 * 4);
        fVar217 = *pfVar12;
        fVar221 = pfVar12[1];
        fVar222 = pfVar12[2];
        pfVar12 = (float *)(lVar68 + uVar58 * 4);
        pfVar13 = (float *)(lVar30 + uVar63 * 4);
        pfVar14 = (float *)(lVar28 + (ulong)uVar117 * 4);
        pfVar15 = (float *)(lVar32 + uVar69 * 4);
        fVar265 = 1.0 - fVar246;
        fVar218 = *pfVar19 * fVar265 + *pfVar8 * fVar246;
        fVar225 = *pfVar3 * fVar265 + *pfVar10 * fVar246;
        fVar228 = fStack_12d0 * fVar265 + *pfVar9 * fVar246;
        fVar231 = fStack_12cc * fVar265 + *pfVar11 * fVar246;
        fVar131 = *(float *)(lVar60 + 4) * fVar265 + pfVar8[1] * fVar246;
        fVar139 = *(float *)(lVar27 + 4) * fVar265 + pfVar10[1] * fVar246;
        fVar141 = *(float *)(lVar31 + uVar72 * 4 + 4) * fVar265 + pfVar9[1] * fVar246;
        fVar143 = *(float *)(lVar33 + uVar71 * 4 + 4) * fVar265 + pfVar11[1] * fVar246;
        fVar253 = *(float *)(lVar60 + 8) * fVar265 + pfVar8[2] * fVar246;
        fVar254 = *(float *)(lVar27 + 8) * fVar265 + pfVar10[2] * fVar246;
        fVar255 = fStack_12b0 * fVar265 + pfVar9[2] * fVar246;
        fVar256 = fStack_12ac * fVar265 + pfVar11[2] * fVar246;
        fVar164 = local_13c8 * fVar265 + *pfVar12 * fVar246;
        fVar176 = *pfVar18 * fVar265 + *pfVar14 * fVar246;
        fVar180 = (float)local_12e8._8_4_ * fVar265 + *pfVar13 * fVar246;
        fVar183 = fStack_12dc * fVar265 + *pfVar15 * fVar246;
        fVar145 = fStack_13c4 * fVar265 + pfVar12[1] * fVar246;
        fVar158 = pfVar18[1] * fVar265 + pfVar14[1] * fVar246;
        fVar160 = pfVar19[1] * fVar265 + pfVar13[1] * fVar246;
        fVar162 = pfVar3[1] * fVar265 + pfVar15[1] * fVar246;
        fVar266 = fVar265 * (float)puVar1[1] + fVar246 * pfVar12[2];
        fVar270 = fVar265 * pfVar18[2] + fVar246 * pfVar14[2];
        fVar272 = fVar265 * pfVar19[2] + fVar246 * pfVar13[2];
        fVar274 = fVar265 * pfVar3[2] + fVar246 * pfVar15[2];
        fVar116 = *(float *)(local_1148 + local_1150 * 4);
        fVar196 = *(float *)(local_1148 + local_1150 * 4 + 0x10);
        fVar76 = (*pfVar16 * fVar265 + *pfVar4 * fVar246) - fVar116;
        fVar108 = (*pfVar17 * fVar265 + *pfVar6 * fVar246) - fVar116;
        fVar110 = (fStack_13e0 * fVar265 + *pfVar5 * fVar246) - fVar116;
        fVar113 = (fStack_13dc * fVar265 + *pfVar7 * fVar246) - fVar116;
        fVar276 = (pfVar16[1] * fVar265 + pfVar4[1] * fVar246) - fVar196;
        fVar278 = (pfVar17[1] * fVar265 + pfVar6[1] * fVar246) - fVar196;
        fVar280 = (*(float *)(lVar29 + 4) * fVar265 + pfVar5[1] * fVar246) - fVar196;
        fVar282 = (*(float *)(lVar2 + 4) * fVar265 + pfVar7[1] * fVar246) - fVar196;
        fVar219 = fVar218 - fVar116;
        fVar226 = fVar225 - fVar116;
        fVar229 = fVar228 - fVar116;
        fVar232 = fVar231 - fVar116;
        fVar165 = fVar164 - fVar116;
        fVar177 = fVar176 - fVar116;
        fVar181 = fVar180 - fVar116;
        fVar116 = fVar183 - fVar116;
        fVar197 = fVar131 - fVar196;
        fVar206 = fVar139 - fVar196;
        fVar208 = fVar141 - fVar196;
        fVar210 = fVar143 - fVar196;
        fVar185 = fVar145 - fVar196;
        fVar193 = fVar158 - fVar196;
        fVar195 = fVar160 - fVar196;
        fVar196 = fVar162 - fVar196;
        fVar144 = *(float *)(local_1148 + local_1150 * 4 + 0x20);
        fVar257 = (pfVar16[2] * fVar265 + pfVar4[2] * fVar246) - fVar144;
        fVar259 = (pfVar17[2] * fVar265 + pfVar6[2] * fVar246) - fVar144;
        fVar261 = (*(float *)(lVar29 + 8) * fVar265 + pfVar5[2] * fVar246) - fVar144;
        fVar263 = (*(float *)(lVar2 + 8) * fVar265 + pfVar7[2] * fVar246) - fVar144;
        fVar166 = fVar253 - fVar144;
        fVar178 = fVar254 - fVar144;
        fVar182 = fVar255 - fVar144;
        fVar184 = fVar256 - fVar144;
        fVar132 = fVar266 - fVar144;
        fVar140 = fVar270 - fVar144;
        fVar142 = fVar272 - fVar144;
        fVar144 = fVar274 - fVar144;
        fVar234 = fVar165 - fVar76;
        fVar236 = fVar177 - fVar108;
        fVar238 = fVar181 - fVar110;
        fVar240 = fVar116 - fVar113;
        fVar247 = fVar185 - fVar276;
        fVar251 = fVar193 - fVar278;
        fStack_1190 = fVar195 - fVar280;
        fStack_118c = fVar196 - fVar282;
        fVar242 = fVar132 - fVar257;
        fVar245 = fVar140 - fVar259;
        fStack_1180 = fVar142 - fVar261;
        fStack_117c = fVar144 - fVar263;
        _local_1188 = CONCAT44(fVar245,fVar242);
        _local_1198 = CONCAT44(fVar251,fVar247);
        fVar252 = *(float *)(local_1148 + local_1150 * 4 + 0x50);
        fVar146 = *(float *)(local_1148 + local_1150 * 4 + 0x60);
        fStack_1350 = *(float *)(local_1148 + local_1150 * 4 + 0x40);
        _local_1358 = CONCAT44(fStack_1350,fStack_1350);
        local_fc8 = (fVar247 * (fVar132 + fVar257) - (fVar185 + fVar276) * fVar242) * fStack_1350 +
                    ((fVar165 + fVar76) * fVar242 - (fVar132 + fVar257) * fVar234) * fVar252 +
                    (fVar234 * (fVar185 + fVar276) - (fVar165 + fVar76) * fVar247) * fVar146;
        fStack_fc4 = (fVar251 * (fVar140 + fVar259) - (fVar193 + fVar278) * fVar245) * fStack_1350 +
                     ((fVar177 + fVar108) * fVar245 - (fVar140 + fVar259) * fVar236) * fVar252 +
                     (fVar236 * (fVar193 + fVar278) - (fVar177 + fVar108) * fVar251) * fVar146;
        fStack_fc0 = (fStack_1190 * (fVar142 + fVar261) - (fVar195 + fVar280) * fStack_1180) *
                     fStack_1350 +
                     ((fVar181 + fVar110) * fStack_1180 - (fVar142 + fVar261) * fVar238) * fVar252 +
                     (fVar238 * (fVar195 + fVar280) - (fVar181 + fVar110) * fStack_1190) * fVar146;
        fStack_fbc = (fStack_118c * (fVar144 + fVar263) - (fVar196 + fVar282) * fStack_117c) *
                     fStack_1350 +
                     ((fVar116 + fVar113) * fStack_117c - (fVar144 + fVar263) * fVar240) * fVar252 +
                     (fVar240 * (fVar196 + fVar282) - (fVar116 + fVar113) * fStack_118c) * fVar146;
        fVar235 = fVar76 - fVar219;
        fVar237 = fVar108 - fVar226;
        fVar239 = fVar110 - fVar229;
        fVar241 = fVar113 - fVar232;
        fVar220 = fVar276 - fVar197;
        fVar227 = fVar278 - fVar206;
        fVar230 = fVar280 - fVar208;
        fVar233 = fVar282 - fVar210;
        fVar77 = fVar257 - fVar166;
        fVar109 = fVar259 - fVar178;
        fStack_11a0 = fVar261 - fVar182;
        fStack_119c = fVar263 - fVar184;
        _local_11a8 = CONCAT44(fVar109,fVar77);
        local_fa8._0_4_ =
             (fVar220 * (fVar257 + fVar166) - (fVar276 + fVar197) * fVar77) * fStack_1350 +
             ((fVar76 + fVar219) * fVar77 - (fVar257 + fVar166) * fVar235) * fVar252 +
             (fVar235 * (fVar276 + fVar197) - (fVar76 + fVar219) * fVar220) * fVar146;
        local_fa8._4_4_ =
             (fVar227 * (fVar259 + fVar178) - (fVar278 + fVar206) * fVar109) * fStack_1350 +
             ((fVar108 + fVar226) * fVar109 - (fVar259 + fVar178) * fVar237) * fVar252 +
             (fVar237 * (fVar278 + fVar206) - (fVar108 + fVar226) * fVar227) * fVar146;
        local_fa8._8_4_ =
             (fVar230 * (fVar261 + fVar182) - (fVar280 + fVar208) * fStack_11a0) * fStack_1350 +
             ((fVar110 + fVar229) * fStack_11a0 - (fVar261 + fVar182) * fVar239) * fVar252 +
             (fVar239 * (fVar280 + fVar208) - (fVar110 + fVar229) * fVar230) * fVar146;
        local_fa8._12_4_ =
             (fVar233 * (fVar263 + fVar184) - (fVar282 + fVar210) * fStack_119c) * fStack_1350 +
             ((fVar113 + fVar232) * fStack_119c - (fVar263 + fVar184) * fVar241) * fVar252 +
             (fVar241 * (fVar282 + fVar210) - (fVar113 + fVar232) * fVar233) * fVar146;
        fVar267 = fVar219 - fVar165;
        fVar271 = fVar226 - fVar177;
        fVar273 = fVar229 - fVar181;
        fVar275 = fVar232 - fVar116;
        fVar277 = fVar197 - fVar185;
        fVar279 = fVar206 - fVar193;
        fVar281 = fVar208 - fVar195;
        fVar283 = fVar210 - fVar196;
        fVar258 = fVar166 - fVar132;
        fVar260 = fVar178 - fVar140;
        fVar262 = fVar182 - fVar142;
        fVar264 = fVar184 - fVar144;
        auVar172._0_4_ =
             (fVar277 * (fVar132 + fVar166) - (fVar185 + fVar197) * fVar258) * fStack_1350 +
             ((fVar165 + fVar219) * fVar258 - (fVar132 + fVar166) * fVar267) * fVar252 +
             (fVar267 * (fVar185 + fVar197) - (fVar165 + fVar219) * fVar277) * fVar146;
        auVar172._4_4_ =
             (fVar279 * (fVar140 + fVar178) - (fVar193 + fVar206) * fVar260) * fStack_1350 +
             ((fVar177 + fVar226) * fVar260 - (fVar140 + fVar178) * fVar271) * fVar252 +
             (fVar271 * (fVar193 + fVar206) - (fVar177 + fVar226) * fVar279) * fVar146;
        auVar172._8_4_ =
             (fVar281 * (fVar142 + fVar182) - (fVar195 + fVar208) * fVar262) * fStack_1350 +
             ((fVar181 + fVar229) * fVar262 - (fVar142 + fVar182) * fVar273) * fVar252 +
             (fVar273 * (fVar195 + fVar208) - (fVar181 + fVar229) * fVar281) * fVar146;
        auVar172._12_4_ =
             (fVar283 * (fVar144 + fVar184) - (fVar196 + fVar210) * fVar264) * fStack_1350 +
             ((fVar116 + fVar232) * fVar264 - (fVar144 + fVar184) * fVar275) * fVar252 +
             (fVar275 * (fVar196 + fVar210) - (fVar116 + fVar232) * fVar283) * fVar146;
        local_fb8 = local_fc8 + local_fa8._0_4_ + auVar172._0_4_;
        fStack_fb4 = fStack_fc4 + local_fa8._4_4_ + auVar172._4_4_;
        fStack_fb0 = fStack_fc0 + local_fa8._8_4_ + auVar172._8_4_;
        fStack_fac = fStack_fbc + local_fa8._12_4_ + auVar172._12_4_;
        auVar86._4_4_ = fStack_fc4;
        auVar86._0_4_ = local_fc8;
        auVar86._8_4_ = fStack_fc0;
        auVar86._12_4_ = fStack_fbc;
        auVar87 = minps(auVar86,local_fa8);
        auVar87 = minps(auVar87,auVar172);
        auVar201._4_4_ = fStack_fc4;
        auVar201._0_4_ = local_fc8;
        auVar201._8_4_ = fStack_fc0;
        auVar201._12_4_ = fStack_fbc;
        auVar202 = maxps(auVar201,local_fa8);
        auVar202 = maxps(auVar202,auVar172);
        fVar116 = ABS(local_fb8) * 1.1920929e-07;
        fVar196 = ABS(fStack_fb4) * 1.1920929e-07;
        fVar144 = ABS(fStack_fb0) * 1.1920929e-07;
        fVar132 = ABS(fStack_fac) * 1.1920929e-07;
        auVar203._4_4_ = -(uint)(auVar202._4_4_ <= fVar196);
        auVar203._0_4_ = -(uint)(auVar202._0_4_ <= fVar116);
        auVar203._8_4_ = -(uint)(auVar202._8_4_ <= fVar144);
        auVar203._12_4_ = -(uint)(auVar202._12_4_ <= fVar132);
        auVar88._4_4_ = -(uint)(-fVar196 <= auVar87._4_4_);
        auVar88._0_4_ = -(uint)(-fVar116 <= auVar87._0_4_);
        auVar88._8_4_ = -(uint)(-fVar144 <= auVar87._8_4_);
        auVar88._12_4_ = -(uint)(-fVar132 <= auVar87._12_4_);
        auVar203 = auVar203 | auVar88;
        lVar65 = uVar67 + lVar65;
        uVar61 = 0;
        uVar50 = movmskps(uVar117,auVar203);
        if (uVar50 != 0) {
          local_f88 = fVar277;
          fStack_f84 = fVar279;
          fStack_f80 = fVar281;
          fStack_f7c = fVar283;
          local_f98 = fVar258;
          fStack_f94 = fVar260;
          fStack_f90 = fVar262;
          fStack_f8c = fVar264;
          auVar223._0_4_ = fVar220 * fVar258 - fVar277 * fVar77;
          auVar223._4_4_ = fVar227 * fVar260 - fVar279 * fVar109;
          auVar223._8_4_ = fVar230 * fVar262 - fVar281 * fStack_11a0;
          auVar223._12_4_ = fVar233 * fVar264 - fVar283 * fStack_119c;
          auVar89._4_4_ = -(uint)(ABS(fVar227 * fVar245) < ABS(fVar279 * fVar109));
          auVar89._0_4_ = -(uint)(ABS(fVar220 * fVar242) < ABS(fVar277 * fVar77));
          auVar89._8_4_ = -(uint)(ABS(fVar230 * fStack_1180) < ABS(fVar281 * fStack_11a0));
          auVar89._12_4_ = -(uint)(ABS(fVar233 * fStack_117c) < ABS(fVar283 * fStack_119c));
          auVar39._4_4_ = fVar251 * fVar109 - fVar227 * fVar245;
          auVar39._0_4_ = fVar247 * fVar77 - fVar220 * fVar242;
          auVar39._8_4_ = fStack_1190 * fStack_11a0 - fVar230 * fStack_1180;
          auVar39._12_4_ = fStack_118c * fStack_119c - fVar233 * fStack_117c;
          local_11e8 = blendvps(auVar223,auVar39,auVar89);
          auVar268._0_4_ = fVar267 * fVar77 - fVar235 * fVar258;
          auVar268._4_4_ = fVar271 * fVar109 - fVar237 * fVar260;
          auVar268._8_4_ = fVar273 * fStack_11a0 - fVar239 * fVar262;
          auVar268._12_4_ = fVar275 * fStack_119c - fVar241 * fVar264;
          auVar90._4_4_ = -(uint)(ABS(fVar236 * fVar109) < ABS(fVar237 * fVar260));
          auVar90._0_4_ = -(uint)(ABS(fVar234 * fVar77) < ABS(fVar235 * fVar258));
          auVar90._8_4_ = -(uint)(ABS(fVar238 * fStack_11a0) < ABS(fVar239 * fVar262));
          auVar90._12_4_ = -(uint)(ABS(fVar240 * fStack_119c) < ABS(fVar241 * fVar264));
          auVar38._4_4_ = fVar245 * fVar237 - fVar236 * fVar109;
          auVar38._0_4_ = fVar242 * fVar235 - fVar234 * fVar77;
          auVar38._8_4_ = fStack_1180 * fVar239 - fVar238 * fStack_11a0;
          auVar38._12_4_ = fStack_117c * fVar241 - fVar240 * fStack_119c;
          local_11d8 = blendvps(auVar268,auVar38,auVar90);
          auVar213._0_4_ = fVar235 * fVar277 - fVar267 * fVar220;
          auVar213._4_4_ = fVar237 * fVar279 - fVar271 * fVar227;
          auVar213._8_4_ = fVar239 * fVar281 - fVar273 * fVar230;
          auVar213._12_4_ = fVar241 * fVar283 - fVar275 * fVar233;
          auVar91._4_4_ = -(uint)(ABS(fVar237 * fVar251) < ABS(fVar271 * fVar227));
          auVar91._0_4_ = -(uint)(ABS(fVar235 * fVar247) < ABS(fVar267 * fVar220));
          auVar91._8_4_ = -(uint)(ABS(fVar239 * fStack_1190) < ABS(fVar273 * fVar230));
          auVar91._12_4_ = -(uint)(ABS(fVar241 * fStack_118c) < ABS(fVar275 * fVar233));
          auVar41._4_4_ = fVar236 * fVar227 - fVar237 * fVar251;
          auVar41._0_4_ = fVar234 * fVar220 - fVar235 * fVar247;
          auVar41._8_4_ = fVar238 * fVar230 - fVar239 * fStack_1190;
          auVar41._12_4_ = fVar240 * fVar233 - fVar241 * fStack_118c;
          local_11c8 = blendvps(auVar213,auVar41,auVar91);
          fVar116 = fStack_1350 * local_11e8._0_4_ +
                    fVar252 * local_11d8._0_4_ + fVar146 * local_11c8._0_4_;
          fVar196 = fStack_1350 * local_11e8._4_4_ +
                    fVar252 * local_11d8._4_4_ + fVar146 * local_11c8._4_4_;
          fVar144 = fStack_1350 * local_11e8._8_4_ +
                    fVar252 * local_11d8._8_4_ + fVar146 * local_11c8._8_4_;
          fVar252 = fStack_1350 * local_11e8._12_4_ +
                    fVar252 * local_11d8._12_4_ + fVar146 * local_11c8._12_4_;
          auVar248._0_4_ = fVar116 + fVar116;
          auVar248._4_4_ = fVar196 + fVar196;
          auVar248._8_4_ = fVar144 + fVar144;
          auVar248._12_4_ = fVar252 + fVar252;
          auVar92._0_4_ = fVar257 * local_11c8._0_4_;
          auVar92._4_4_ = fVar259 * local_11c8._4_4_;
          auVar92._8_4_ = fVar261 * local_11c8._8_4_;
          auVar92._12_4_ = fVar263 * local_11c8._12_4_;
          fVar146 = fVar76 * local_11e8._0_4_ + fVar276 * local_11d8._0_4_ + auVar92._0_4_;
          fVar76 = fVar108 * local_11e8._4_4_ + fVar278 * local_11d8._4_4_ + auVar92._4_4_;
          fVar77 = fVar110 * local_11e8._8_4_ + fVar280 * local_11d8._8_4_ + auVar92._8_4_;
          fVar108 = fVar113 * local_11e8._12_4_ + fVar282 * local_11d8._12_4_ + auVar92._12_4_;
          auVar87 = rcpps(auVar92,auVar248);
          fVar116 = auVar87._0_4_;
          fVar196 = auVar87._4_4_;
          fVar144 = auVar87._8_4_;
          fVar252 = auVar87._12_4_;
          auVar150._0_4_ = fVar146 + fVar146;
          auVar150._4_4_ = fVar76 + fVar76;
          auVar150._8_4_ = fVar77 + fVar77;
          auVar150._12_4_ = fVar108 + fVar108;
          auVar243._0_4_ = ((1.0 - auVar248._0_4_ * fVar116) * fVar116 + fVar116) * auVar150._0_4_;
          auVar243._4_4_ = ((1.0 - auVar248._4_4_ * fVar196) * fVar196 + fVar196) * auVar150._4_4_;
          auVar243._8_4_ = ((1.0 - auVar248._8_4_ * fVar144) * fVar144 + fVar144) * auVar150._8_4_;
          auVar243._12_4_ =
               ((1.0 - auVar248._12_4_ * fVar252) * fVar252 + fVar252) * auVar150._12_4_;
          fVar116 = *(float *)(local_1148 + local_1150 * 4 + 0x80);
          fVar196 = *(float *)(local_1148 + local_1150 * 4 + 0x30);
          auVar118._0_4_ =
               -(uint)(auVar243._0_4_ <= fVar116 && fVar196 <= auVar243._0_4_) & auVar203._0_4_;
          auVar118._4_4_ =
               -(uint)(auVar243._4_4_ <= fVar116 && fVar196 <= auVar243._4_4_) & auVar203._4_4_;
          auVar118._8_4_ =
               -(uint)(auVar243._8_4_ <= fVar116 && fVar196 <= auVar243._8_4_) & auVar203._8_4_;
          auVar118._12_4_ =
               -(uint)(auVar243._12_4_ <= fVar116 && fVar196 <= auVar243._12_4_) & auVar203._12_4_;
          uVar50 = movmskps(uVar50,auVar118);
          if (uVar50 != 0) {
            uVar117 = auVar118._0_4_ & -(uint)(auVar248._0_4_ != 0.0);
            uVar130 = auVar118._4_4_ & -(uint)(auVar248._4_4_ != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar130,uVar117);
            valid.field_0.i[2] = auVar118._8_4_ & -(uint)(auVar248._8_4_ != 0.0);
            valid.field_0.i[3] = auVar118._12_4_ & -(uint)(auVar248._12_4_ != 0.0);
            uVar50 = movmskps(uVar50,(undefined1  [16])valid.field_0);
            if (uVar50 != 0) {
              tNear.field_0.v[1] = fStack_fc4;
              tNear.field_0.v[0] = local_fc8;
              tNear.field_0.v[2] = fStack_fc0;
              tNear.field_0.v[3] = fStack_fbc;
              auVar48._4_4_ = fStack_fb4;
              auVar48._0_4_ = local_fb8;
              auVar48._8_4_ = fStack_fb0;
              auVar48._12_4_ = fStack_fac;
              local_11f8 = auVar243;
              local_11b8._8_8_ = uStack_fd0;
              local_11b8._0_8_ = local_fd8;
              auVar87 = rcpps(auVar150,auVar48);
              fVar196 = auVar87._0_4_;
              fVar144 = auVar87._4_4_;
              fVar252 = auVar87._8_4_;
              fVar146 = auVar87._12_4_;
              fVar76 = (float)DAT_01feca10;
              fVar77 = DAT_01feca10._4_4_;
              fVar108 = DAT_01feca10._12_4_;
              fVar116 = DAT_01feca10._8_4_;
              fVar196 = (float)(-(uint)(1e-18 <= ABS(local_fb8)) &
                               (uint)((fVar76 - local_fb8 * fVar196) * fVar196 + fVar196));
              fVar144 = (float)(-(uint)(1e-18 <= ABS(fStack_fb4)) &
                               (uint)((fVar77 - fStack_fb4 * fVar144) * fVar144 + fVar144));
              fVar252 = (float)(-(uint)(1e-18 <= ABS(fStack_fb0)) &
                               (uint)((fVar116 - fStack_fb0 * fVar252) * fVar252 + fVar252));
              fVar146 = (float)(-(uint)(1e-18 <= ABS(fStack_fac)) &
                               (uint)((fVar108 - fStack_fac * fVar146) * fVar146 + fVar146));
              auVar191._0_4_ = local_fc8 * fVar196;
              auVar191._4_4_ = fStack_fc4 * fVar144;
              auVar191._8_4_ = fStack_fc0 * fVar252;
              auVar191._12_4_ = fStack_fbc * fVar146;
              auVar202 = minps(auVar191,_DAT_01feca10);
              auVar173._0_4_ = fVar196 * local_fa8._0_4_;
              auVar173._4_4_ = fVar144 * local_fa8._4_4_;
              auVar173._8_4_ = fVar252 * local_fa8._8_4_;
              auVar173._12_4_ = fVar146 * local_fa8._12_4_;
              auVar87 = minps(auVar173,_DAT_01feca10);
              auVar137._0_4_ = fVar76 - auVar202._0_4_;
              auVar137._4_4_ = fVar77 - auVar202._4_4_;
              auVar137._8_4_ = fVar116 - auVar202._8_4_;
              auVar137._12_4_ = fVar108 - auVar202._12_4_;
              auVar151._0_4_ = fVar76 - auVar87._0_4_;
              auVar151._4_4_ = fVar77 - auVar87._4_4_;
              auVar151._8_4_ = fVar116 - auVar87._8_4_;
              auVar151._12_4_ = fVar108 - auVar87._12_4_;
              local_1218 = blendvps(auVar202,auVar137,local_11b8);
              local_1208 = blendvps(auVar87,auVar151,local_11b8);
              auVar93._8_4_ = valid.field_0.i[2];
              auVar93._0_8_ = valid.field_0._0_8_;
              auVar93._12_4_ = valid.field_0.i[3];
              auVar202 = blendvps(_DAT_01feb9f0,auVar243,auVar93);
              auVar152._4_4_ = auVar202._0_4_;
              auVar152._0_4_ = auVar202._4_4_;
              auVar152._8_4_ = auVar202._12_4_;
              auVar152._12_4_ = auVar202._8_4_;
              auVar87 = minps(auVar152,auVar202);
              auVar94._0_8_ = auVar87._8_8_;
              auVar94._8_4_ = auVar87._0_4_;
              auVar94._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar94,auVar87);
              auVar95._0_8_ =
                   CONCAT44(-(uint)(auVar87._4_4_ == auVar202._4_4_) & uVar130,
                            -(uint)(auVar87._0_4_ == auVar202._0_4_) & uVar117);
              auVar95._8_4_ = -(uint)(auVar87._8_4_ == auVar202._8_4_) & valid.field_0.i[2];
              auVar95._12_4_ = -(uint)(auVar87._12_4_ == auVar202._12_4_) & valid.field_0.i[3];
              iVar51 = movmskps(uVar50,auVar95);
              aVar119 = valid.field_0;
              if (iVar51 != 0) {
                aVar119.i[2] = auVar95._8_4_;
                aVar119._0_8_ = auVar95._0_8_;
                aVar119.i[3] = auVar95._12_4_;
              }
              uVar50 = movmskps(iVar51,(undefined1  [16])aVar119);
              lVar60 = 0;
              fStack_134c = fStack_1350;
              if (uVar50 != 0) {
                for (; (uVar50 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
LAB_0029a2e6:
              uVar50 = *(uint *)(lVar65 + 0x40 + lVar60 * 4);
              pRVar54 = (RTCRayN *)(ulong)uVar50;
              pGVar26 = (pSVar24->geometries).items[(long)pRVar54].ptr;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar60] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar61 = *(undefined4 *)(local_1218 + lVar60 * 4);
                  uVar52 = *(undefined4 *)(local_1208 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11e8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11d8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11c8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar61;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar52;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar65 + 0x50 + lVar60 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar50;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar50 = context->user->instPrimID[0];
                  uVar61 = 0;
                  *(uint *)(ray + k * 4 + 0x140) = uVar50;
                  goto LAB_0029a732;
                }
                local_10c8 = *(undefined4 *)(local_1218 + lVar60 * 4);
                local_10b8 = *(undefined4 *)(local_1208 + lVar60 * 4);
                local_10f8._4_4_ = *(undefined4 *)(local_11e8 + lVar60 * 4);
                local_10e8._4_4_ = *(undefined4 *)(local_11d8 + lVar60 * 4);
                local_1098._4_4_ = uVar50;
                local_1098._0_4_ = uVar50;
                local_1098._8_4_ = uVar50;
                local_1098._12_4_ = uVar50;
                uVar61 = *(undefined4 *)(lVar65 + 0x50 + lVar60 * 4);
                local_10a8._4_4_ = uVar61;
                local_10a8._0_4_ = uVar61;
                local_10a8._8_4_ = uVar61;
                local_10a8._12_4_ = uVar61;
                uVar61 = *(undefined4 *)(local_11c8 + lVar60 * 4);
                local_10d8._4_4_ = uVar61;
                local_10d8._0_4_ = uVar61;
                local_10d8._8_4_ = uVar61;
                local_10d8._12_4_ = uVar61;
                local_10f8._0_4_ = local_10f8._4_4_;
                local_10f8._8_4_ = local_10f8._4_4_;
                local_10f8._12_4_ = local_10f8._4_4_;
                local_10e8._0_4_ = local_10e8._4_4_;
                local_10e8._8_4_ = local_10e8._4_4_;
                local_10e8._12_4_ = local_10e8._4_4_;
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                uStack_10b4 = local_10b8;
                uStack_10b0 = local_10b8;
                uStack_10ac = local_10b8;
                local_1088 = context->user->instID[0];
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                local_1078 = context->user->instPrimID[0];
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar60 * 4);
                local_1368 = *(undefined8 *)(mm_lookupmask_ps + lVar56);
                uStack_1360 = *(undefined8 *)(mm_lookupmask_ps + lVar56 + 8);
                args.valid = (int *)&local_1368;
                args.geometryUserPtr = pGVar26->userPtr;
                args.context = context->user;
                args.ray = (RTCRayN *)ray;
                args.hit = (RTCHitN *)local_10f8;
                args.N = 4;
                pRVar54 = (RTCRayN *)pGVar26->intersectionFilterN;
                if (pRVar54 != (RTCRayN *)0x0) {
                  pRVar54 = (RTCRayN *)(*(code *)pRVar54)(&args);
                }
                auVar44._8_8_ = uStack_1360;
                auVar44._0_8_ = local_1368;
                if (auVar44 == (undefined1  [16])0x0) {
                  auVar120._8_4_ = 0xffffffff;
                  auVar120._0_8_ = 0xffffffffffffffff;
                  auVar120._12_4_ = 0xffffffff;
                  auVar120 = auVar120 ^ _DAT_01febe20;
                }
                else {
                  pRVar54 = (RTCRayN *)context->args->filter;
                  if ((pRVar54 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar54 = (RTCRayN *)(*(code *)pRVar54)(&args);
                  }
                  auVar45._8_8_ = uStack_1360;
                  auVar45._0_8_ = local_1368;
                  auVar96._0_4_ = -(uint)((int)local_1368 == 0);
                  auVar96._4_4_ = -(uint)((int)((ulong)local_1368 >> 0x20) == 0);
                  auVar96._8_4_ = -(uint)((int)uStack_1360 == 0);
                  auVar96._12_4_ = -(uint)((int)((ulong)uStack_1360 >> 0x20) == 0);
                  auVar120 = auVar96 ^ _DAT_01febe20;
                  if (auVar45 != (undefined1  [16])0x0) {
                    auVar87 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar96);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar87;
                    pRVar54 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar120) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar61;
                }
                valid.field_0.v[lVar60] = 0.0;
                fVar116 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar243._4_4_ <= fVar116) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar243._0_4_ <= fVar116) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar243._8_4_ <= fVar116) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar243._12_4_ <= fVar116) & valid.field_0.i[3];
              }
              uVar61 = (undefined4)((ulong)pRVar54 >> 0x20);
              uVar50 = movmskps((int)pRVar54,(undefined1  [16])valid.field_0);
              if (uVar50 == 0) goto LAB_0029a732;
              auVar202 = blendvps(_DAT_01feb9f0,auVar243,(undefined1  [16])valid.field_0);
              auVar153._4_4_ = auVar202._0_4_;
              auVar153._0_4_ = auVar202._4_4_;
              auVar153._8_4_ = auVar202._12_4_;
              auVar153._12_4_ = auVar202._8_4_;
              auVar87 = minps(auVar153,auVar202);
              auVar121._0_8_ = auVar87._8_8_;
              auVar121._8_4_ = auVar87._0_4_;
              auVar121._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar121,auVar87);
              auVar122._0_8_ =
                   CONCAT44(-(uint)(auVar87._4_4_ == auVar202._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar87._0_4_ == auVar202._0_4_) & valid.field_0._0_4_);
              auVar122._8_4_ = -(uint)(auVar87._8_4_ == auVar202._8_4_) & valid.field_0._8_4_;
              auVar122._12_4_ = -(uint)(auVar87._12_4_ == auVar202._12_4_) & valid.field_0._12_4_;
              iVar51 = movmskps(uVar50,auVar122);
              aVar97 = valid.field_0;
              if (iVar51 != 0) {
                aVar97.i[2] = auVar122._8_4_;
                aVar97._0_8_ = auVar122._0_8_;
                aVar97.i[3] = auVar122._12_4_;
              }
              uVar52 = movmskps(iVar51,(undefined1  [16])aVar97);
              lVar60 = 0;
              if (CONCAT44(uVar61,uVar52) != 0) {
                for (; (CONCAT44(uVar61,uVar52) >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
              goto LAB_0029a2e6;
            }
          }
        }
LAB_0029a732:
        fVar116 = *(float *)(ray + k * 4);
        fVar196 = *(float *)(ray + k * 4 + 0x10);
        fVar144 = *(float *)(ray + k * 4 + 0x20);
        fStack_13e4 = *(float *)(ray + k * 4 + 0x40);
        local_13e8 = fStack_13e4;
        fStack_13e0 = fStack_13e4;
        fStack_13dc = fStack_13e4;
        fVar252 = *(float *)(ray + k * 4 + 0x50);
        fVar110 = (fVar111 * fVar265 + fVar147 * fVar246) - fVar116;
        fVar113 = (fVar115 * fVar265 + fVar212 * fVar246) - fVar116;
        fStack_12a0 = (fStack_12a0 * fVar265 + fVar207 * fVar246) - fVar116;
        fStack_129c = (fStack_129c * fVar265 + fVar217 * fVar246) - fVar116;
        fVar147 = (fVar112 * fVar265 + fVar194 * fVar246) - fVar196;
        fVar159 = (fVar159 * fVar265 + fVar215 * fVar246) - fVar196;
        fVar161 = (fVar161 * fVar265 + fVar209 * fVar246) - fVar196;
        fVar163 = (fVar163 * fVar265 + fVar221 * fVar246) - fVar196;
        fVar212 = (fVar114 * fVar265 + fVar198 * fVar246) - fVar144;
        fVar215 = (fVar167 * fVar265 + fVar216 * fVar246) - fVar144;
        fVar216 = (fVar179 * fVar265 + fVar211 * fVar246) - fVar144;
        fVar217 = (fVar186 * fVar265 + fVar222 * fVar246) - fVar144;
        fVar164 = fVar164 - fVar116;
        fVar176 = fVar176 - fVar116;
        fVar180 = fVar180 - fVar116;
        fVar183 = fVar183 - fVar116;
        fVar145 = fVar145 - fVar196;
        fVar158 = fVar158 - fVar196;
        fVar160 = fVar160 - fVar196;
        fVar162 = fVar162 - fVar196;
        fVar266 = fVar266 - fVar144;
        fVar270 = fVar270 - fVar144;
        fVar272 = fVar272 - fVar144;
        fVar274 = fVar274 - fVar144;
        fVar218 = fVar218 - fVar116;
        fVar225 = fVar225 - fVar116;
        fVar228 = fVar228 - fVar116;
        fVar231 = fVar231 - fVar116;
        fVar131 = fVar131 - fVar196;
        fVar139 = fVar139 - fVar196;
        fVar141 = fVar141 - fVar196;
        fVar143 = fVar143 - fVar196;
        fVar253 = fVar253 - fVar144;
        fVar254 = fVar254 - fVar144;
        fVar255 = fVar255 - fVar144;
        fVar256 = fVar256 - fVar144;
        fVar186 = fVar218 - fVar110;
        fVar194 = fVar225 - fVar113;
        fStack_12b0 = fVar228 - fStack_12a0;
        fStack_12ac = fVar231 - fStack_129c;
        fVar221 = fVar131 - fVar147;
        fVar76 = fVar139 - fVar159;
        fStack_12d0 = fVar141 - fVar161;
        fStack_12cc = fVar143 - fVar163;
        fVar198 = fVar253 - fVar212;
        fVar207 = fVar254 - fVar215;
        fVar209 = fVar255 - fVar216;
        fVar211 = fVar256 - fVar217;
        fVar116 = *(float *)(ray + k * 4 + 0x60);
        local_12e8._4_4_ = fVar116;
        local_12e8._0_4_ = fVar116;
        local_12e8._8_4_ = fVar116;
        fStack_12dc = fVar116;
        fVar246 = fVar110 - fVar164;
        fVar144 = fVar113 - fVar176;
        fVar111 = fStack_12a0 - fVar180;
        fVar114 = fStack_129c - fVar183;
        fVar222 = fVar147 - fVar145;
        fVar77 = fVar159 - fVar158;
        fVar108 = fVar161 - fVar160;
        fVar109 = fVar163 - fVar162;
        tNear.field_0.v[0] =
             (fVar221 * (fVar253 + fVar212) - (fVar131 + fVar147) * fVar198) * fStack_13e4 +
             ((fVar218 + fVar110) * fVar198 - (fVar253 + fVar212) * fVar186) * fVar252 +
             (fVar186 * (fVar131 + fVar147) - (fVar218 + fVar110) * fVar221) * fVar116;
        tNear.field_0.v[1] =
             (fVar76 * (fVar254 + fVar215) - (fVar139 + fVar159) * fVar207) * fStack_13e4 +
             ((fVar225 + fVar113) * fVar207 - (fVar254 + fVar215) * fVar194) * fVar252 +
             (fVar194 * (fVar139 + fVar159) - (fVar225 + fVar113) * fVar76) * fVar116;
        tNear.field_0.v[2] =
             (fStack_12d0 * (fVar255 + fVar216) - (fVar141 + fVar161) * fVar209) * fStack_13e4 +
             ((fVar228 + fStack_12a0) * fVar209 - (fVar255 + fVar216) * fStack_12b0) * fVar252 +
             (fStack_12b0 * (fVar141 + fVar161) - (fVar228 + fStack_12a0) * fStack_12d0) * fVar116;
        tNear.field_0.v[3] =
             (fStack_12cc * (fVar256 + fVar217) - (fVar143 + fVar163) * fVar211) * fStack_13e4 +
             ((fVar231 + fStack_129c) * fVar211 - (fVar256 + fVar217) * fStack_12ac) * fVar252 +
             (fStack_12ac * (fVar143 + fVar163) - (fVar231 + fStack_129c) * fStack_12cc) * fVar116;
        fVar132 = fVar212 - fVar266;
        fVar142 = fVar215 - fVar270;
        fVar166 = fVar216 - fVar272;
        fVar178 = fVar217 - fVar274;
        auVar204._0_4_ =
             (fVar222 * (fVar212 + fVar266) - (fVar147 + fVar145) * fVar132) * fStack_13e4 +
             ((fVar110 + fVar164) * fVar132 - (fVar212 + fVar266) * fVar246) * fVar252 +
             (fVar246 * (fVar147 + fVar145) - (fVar110 + fVar164) * fVar222) * fVar116;
        auVar204._4_4_ =
             (fVar77 * (fVar215 + fVar270) - (fVar159 + fVar158) * fVar142) * fStack_13e4 +
             ((fVar113 + fVar176) * fVar142 - (fVar215 + fVar270) * fVar144) * fVar252 +
             (fVar144 * (fVar159 + fVar158) - (fVar113 + fVar176) * fVar77) * fVar116;
        auVar204._8_4_ =
             (fVar108 * (fVar216 + fVar272) - (fVar161 + fVar160) * fVar166) * fStack_13e4 +
             ((fStack_12a0 + fVar180) * fVar166 - (fVar216 + fVar272) * fVar111) * fVar252 +
             (fVar111 * (fVar161 + fVar160) - (fStack_12a0 + fVar180) * fVar108) * fVar116;
        auVar204._12_4_ =
             (fVar109 * (fVar217 + fVar274) - (fVar163 + fVar162) * fVar178) * fStack_13e4 +
             ((fStack_129c + fVar183) * fVar178 - (fVar217 + fVar274) * fVar114) * fVar252 +
             (fVar114 * (fVar163 + fVar162) - (fStack_129c + fVar183) * fVar109) * fVar116;
        fVar140 = fVar164 - fVar218;
        fVar165 = fVar176 - fVar225;
        fVar177 = fVar180 - fVar228;
        fVar181 = fVar183 - fVar231;
        fVar167 = fVar145 - fVar131;
        fVar179 = fVar158 - fVar139;
        fStack_1350 = fVar160 - fVar141;
        fStack_134c = fVar162 - fVar143;
        fVar182 = fVar266 - fVar253;
        fVar184 = fVar270 - fVar254;
        fVar185 = fVar272 - fVar255;
        fVar193 = fVar274 - fVar256;
        auVar98._0_4_ =
             (fVar167 * (fVar253 + fVar266) - (fVar131 + fVar145) * fVar182) * fStack_13e4 +
             ((fVar218 + fVar164) * fVar182 - (fVar253 + fVar266) * fVar140) * fVar252 +
             (fVar140 * (fVar131 + fVar145) - (fVar218 + fVar164) * fVar167) * fVar116;
        auVar98._4_4_ =
             (fVar179 * (fVar254 + fVar270) - (fVar139 + fVar158) * fVar184) * fStack_13e4 +
             ((fVar225 + fVar176) * fVar184 - (fVar254 + fVar270) * fVar165) * fVar252 +
             (fVar165 * (fVar139 + fVar158) - (fVar225 + fVar176) * fVar179) * fVar116;
        auVar98._8_4_ =
             (fStack_1350 * (fVar255 + fVar272) - (fVar141 + fVar160) * fVar185) * fStack_13e4 +
             ((fVar228 + fVar180) * fVar185 - (fVar255 + fVar272) * fVar177) * fVar252 +
             (fVar177 * (fVar141 + fVar160) - (fVar228 + fVar180) * fStack_1350) * fVar116;
        auVar98._12_4_ =
             (fStack_134c * (fVar256 + fVar274) - (fVar143 + fVar162) * fVar193) * fStack_13e4 +
             ((fVar231 + fVar183) * fVar193 - (fVar256 + fVar274) * fVar181) * fVar252 +
             (fVar181 * (fVar143 + fVar162) - (fVar231 + fVar183) * fStack_134c) * fVar116;
        fVar131 = tNear.field_0.v[0] + auVar204._0_4_ + auVar98._0_4_;
        fVar139 = tNear.field_0.v[1] + auVar204._4_4_ + auVar98._4_4_;
        fVar141 = tNear.field_0.v[2] + auVar204._8_4_ + auVar98._8_4_;
        fVar143 = tNear.field_0.v[3] + auVar204._12_4_ + auVar98._12_4_;
        auVar123._4_4_ = tNear.field_0.i[1];
        auVar123._0_4_ = tNear.field_0.i[0];
        auVar123._8_4_ = tNear.field_0.i[2];
        auVar123._12_4_ = tNear.field_0.i[3];
        auVar87 = minps(auVar123,auVar204);
        auVar87 = minps(auVar87,auVar98);
        auVar174._4_4_ = tNear.field_0.i[1];
        auVar174._0_4_ = tNear.field_0.i[0];
        auVar174._8_4_ = tNear.field_0.i[2];
        auVar174._12_4_ = tNear.field_0.i[3];
        auVar202 = maxps(auVar174,auVar204);
        auVar202 = maxps(auVar202,auVar98);
        fVar196 = ABS(fVar131) * 1.1920929e-07;
        fVar146 = ABS(fVar139) * 1.1920929e-07;
        fVar112 = ABS(fVar141) * 1.1920929e-07;
        fVar115 = ABS(fVar143) * 1.1920929e-07;
        auVar175._4_4_ = -(uint)(auVar202._4_4_ <= fVar146);
        auVar175._0_4_ = -(uint)(auVar202._0_4_ <= fVar196);
        auVar175._8_4_ = -(uint)(auVar202._8_4_ <= fVar112);
        auVar175._12_4_ = -(uint)(auVar202._12_4_ <= fVar115);
        auVar124._4_4_ = -(uint)(-fVar146 <= auVar87._4_4_);
        auVar124._0_4_ = -(uint)(-fVar196 <= auVar87._0_4_);
        auVar124._8_4_ = -(uint)(-fVar112 <= auVar87._8_4_);
        auVar124._12_4_ = -(uint)(-fVar115 <= auVar87._12_4_);
        auVar175 = auVar175 | auVar124;
        iVar51 = movmskps(uVar50,auVar175);
        if (iVar51 != 0) {
          _local_1358 = CONCAT44(fVar179,fVar167);
          auVar249._0_4_ = fVar221 * fVar132 - fVar222 * fVar198;
          auVar249._4_4_ = fVar76 * fVar142 - fVar77 * fVar207;
          auVar249._8_4_ = fStack_12d0 * fVar166 - fVar108 * fVar209;
          auVar249._12_4_ = fStack_12cc * fVar178 - fVar109 * fVar211;
          auVar192._0_4_ = fVar222 * fVar182 - fVar167 * fVar132;
          auVar192._4_4_ = fVar77 * fVar184 - fVar179 * fVar142;
          auVar192._8_4_ = fVar108 * fVar185 - fStack_1350 * fVar166;
          auVar192._12_4_ = fVar109 * fVar193 - fStack_134c * fVar178;
          auVar99._4_4_ = -(uint)(ABS(fVar77 * fVar207) < ABS(fVar179 * fVar142));
          auVar99._0_4_ = -(uint)(ABS(fVar222 * fVar198) < ABS(fVar167 * fVar132));
          auVar99._8_4_ = -(uint)(ABS(fVar108 * fVar209) < ABS(fStack_1350 * fVar166));
          auVar99._12_4_ = -(uint)(ABS(fVar109 * fVar211) < ABS(fStack_134c * fVar178));
          local_11e8 = blendvps(auVar192,auVar249,auVar99);
          auVar250._0_4_ = fVar140 * fVar132 - fVar246 * fVar182;
          auVar250._4_4_ = fVar165 * fVar142 - fVar144 * fVar184;
          auVar250._8_4_ = fVar177 * fVar166 - fVar111 * fVar185;
          auVar250._12_4_ = fVar181 * fVar178 - fVar114 * fVar193;
          auVar100._4_4_ = -(uint)(ABS(fVar194 * fVar142) < ABS(fVar144 * fVar184));
          auVar100._0_4_ = -(uint)(ABS(fVar186 * fVar132) < ABS(fVar246 * fVar182));
          auVar100._8_4_ = -(uint)(ABS(fStack_12b0 * fVar166) < ABS(fVar111 * fVar185));
          auVar100._12_4_ = -(uint)(ABS(fStack_12ac * fVar178) < ABS(fVar114 * fVar193));
          auVar42._4_4_ = fVar207 * fVar144 - fVar194 * fVar142;
          auVar42._0_4_ = fVar198 * fVar246 - fVar186 * fVar132;
          auVar42._8_4_ = fVar209 * fVar111 - fStack_12b0 * fVar166;
          auVar42._12_4_ = fVar211 * fVar114 - fStack_12ac * fVar178;
          local_11d8 = blendvps(auVar250,auVar42,auVar100);
          auVar224._0_4_ = fVar186 * fVar222 - fVar246 * fVar221;
          auVar224._4_4_ = fVar194 * fVar77 - fVar144 * fVar76;
          auVar224._8_4_ = fStack_12b0 * fVar108 - fVar111 * fStack_12d0;
          auVar224._12_4_ = fStack_12ac * fVar109 - fVar114 * fStack_12cc;
          auVar205._0_4_ = fVar246 * fVar167 - fVar140 * fVar222;
          auVar205._4_4_ = fVar144 * fVar179 - fVar165 * fVar77;
          auVar205._8_4_ = fVar111 * fStack_1350 - fVar177 * fVar108;
          auVar205._12_4_ = fVar114 * fStack_134c - fVar181 * fVar109;
          auVar101._4_4_ = -(uint)(ABS(fVar144 * fVar76) < ABS(fVar165 * fVar77));
          auVar101._0_4_ = -(uint)(ABS(fVar246 * fVar221) < ABS(fVar140 * fVar222));
          auVar101._8_4_ = -(uint)(ABS(fVar111 * fStack_12d0) < ABS(fVar177 * fVar108));
          auVar101._12_4_ = -(uint)(ABS(fVar114 * fStack_12cc) < ABS(fVar181 * fVar109));
          local_11c8 = blendvps(auVar205,auVar224,auVar101);
          fVar114 = fStack_13e4 * local_11e8._0_4_ +
                    fVar252 * local_11d8._0_4_ + fVar116 * local_11c8._0_4_;
          fVar115 = fStack_13e4 * local_11e8._4_4_ +
                    fVar252 * local_11d8._4_4_ + fVar116 * local_11c8._4_4_;
          fVar167 = fStack_13e4 * local_11e8._8_4_ +
                    fVar252 * local_11d8._8_4_ + fVar116 * local_11c8._8_4_;
          fVar179 = fStack_13e4 * local_11e8._12_4_ +
                    fVar252 * local_11d8._12_4_ + fVar116 * local_11c8._12_4_;
          fVar114 = fVar114 + fVar114;
          fVar115 = fVar115 + fVar115;
          fVar167 = fVar167 + fVar167;
          fVar179 = fVar179 + fVar179;
          auVar102._0_4_ = fVar212 * local_11c8._0_4_;
          auVar102._4_4_ = fVar215 * local_11c8._4_4_;
          auVar102._8_4_ = fVar216 * local_11c8._8_4_;
          auVar102._12_4_ = fVar217 * local_11c8._12_4_;
          fVar252 = fVar110 * local_11e8._0_4_ + fVar147 * local_11d8._0_4_ + auVar102._0_4_;
          fVar146 = fVar113 * local_11e8._4_4_ + fVar159 * local_11d8._4_4_ + auVar102._4_4_;
          fVar111 = fStack_12a0 * local_11e8._8_4_ + fVar161 * local_11d8._8_4_ + auVar102._8_4_;
          fVar112 = fStack_129c * local_11e8._12_4_ + fVar163 * local_11d8._12_4_ + auVar102._12_4_;
          auVar40._4_4_ = fVar115;
          auVar40._0_4_ = fVar114;
          auVar40._8_4_ = fVar167;
          auVar40._12_4_ = fVar179;
          auVar87 = rcpps(auVar102,auVar40);
          fVar116 = auVar87._0_4_;
          fVar246 = auVar87._4_4_;
          fVar196 = auVar87._8_4_;
          fVar144 = auVar87._12_4_;
          auVar154._0_4_ = fVar252 + fVar252;
          auVar154._4_4_ = fVar146 + fVar146;
          auVar154._8_4_ = fVar111 + fVar111;
          auVar154._12_4_ = fVar112 + fVar112;
          auVar214._0_4_ = ((1.0 - fVar114 * fVar116) * fVar116 + fVar116) * auVar154._0_4_;
          auVar214._4_4_ = ((1.0 - fVar115 * fVar246) * fVar246 + fVar246) * auVar154._4_4_;
          auVar214._8_4_ = ((1.0 - fVar167 * fVar196) * fVar196 + fVar196) * auVar154._8_4_;
          auVar214._12_4_ = ((1.0 - fVar179 * fVar144) * fVar144 + fVar144) * auVar154._12_4_;
          fVar116 = *(float *)(ray + k * 4 + 0x80);
          fVar246 = *(float *)(ray + k * 4 + 0x30);
          auVar125._0_4_ =
               -(uint)(auVar214._0_4_ <= fVar116 && fVar246 <= auVar214._0_4_) & auVar175._0_4_;
          auVar125._4_4_ =
               -(uint)(auVar214._4_4_ <= fVar116 && fVar246 <= auVar214._4_4_) & auVar175._4_4_;
          auVar125._8_4_ =
               -(uint)(auVar214._8_4_ <= fVar116 && fVar246 <= auVar214._8_4_) & auVar175._8_4_;
          auVar125._12_4_ =
               -(uint)(auVar214._12_4_ <= fVar116 && fVar246 <= auVar214._12_4_) & auVar175._12_4_;
          iVar51 = movmskps(iVar51,auVar125);
          if (iVar51 != 0) {
            uVar50 = auVar125._0_4_ & -(uint)(fVar114 != 0.0);
            uVar117 = auVar125._4_4_ & -(uint)(fVar115 != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar117,uVar50);
            valid.field_0.i[2] = auVar125._8_4_ & -(uint)(fVar167 != 0.0);
            valid.field_0.i[3] = auVar125._12_4_ & -(uint)(fVar179 != 0.0);
            iVar51 = movmskps(iVar51,(undefined1  [16])valid.field_0);
            if (iVar51 != 0) {
              auVar43._4_4_ = fVar139;
              auVar43._0_4_ = fVar131;
              auVar43._8_4_ = fVar141;
              auVar43._12_4_ = fVar143;
              local_11f8 = auVar214;
              local_11b8._8_8_ = uStack_fe0;
              local_11b8._0_8_ = local_fe8;
              pSVar24 = context->scene;
              auVar87 = rcpps(auVar154,auVar43);
              fVar246 = auVar87._0_4_;
              fVar196 = auVar87._4_4_;
              fVar144 = auVar87._8_4_;
              fVar252 = auVar87._12_4_;
              fVar146 = (float)DAT_01feca10;
              fVar111 = DAT_01feca10._4_4_;
              fVar112 = DAT_01feca10._12_4_;
              fVar116 = DAT_01feca10._8_4_;
              fVar246 = (float)(-(uint)(1e-18 <= ABS(fVar131)) &
                               (uint)((fVar146 - fVar131 * fVar246) * fVar246 + fVar246));
              fVar196 = (float)(-(uint)(1e-18 <= ABS(fVar139)) &
                               (uint)((fVar111 - fVar139 * fVar196) * fVar196 + fVar196));
              fVar144 = (float)(-(uint)(1e-18 <= ABS(fVar141)) &
                               (uint)((fVar116 - fVar141 * fVar144) * fVar144 + fVar144));
              fVar252 = (float)(-(uint)(1e-18 <= ABS(fVar143)) &
                               (uint)((fVar112 - fVar143 * fVar252) * fVar252 + fVar252));
              auVar244._0_4_ = tNear.field_0.v[0] * fVar246;
              auVar244._4_4_ = tNear.field_0.v[1] * fVar196;
              auVar244._8_4_ = tNear.field_0.v[2] * fVar144;
              auVar244._12_4_ = tNear.field_0.v[3] * fVar252;
              auVar87 = minps(auVar244,_DAT_01feca10);
              auVar269._0_4_ = fVar246 * auVar204._0_4_;
              auVar269._4_4_ = fVar196 * auVar204._4_4_;
              auVar269._8_4_ = fVar144 * auVar204._8_4_;
              auVar269._12_4_ = fVar252 * auVar204._12_4_;
              auVar202 = minps(auVar269,_DAT_01feca10);
              auVar138._0_4_ = fVar146 - auVar87._0_4_;
              auVar138._4_4_ = fVar111 - auVar87._4_4_;
              auVar138._8_4_ = fVar116 - auVar87._8_4_;
              auVar138._12_4_ = fVar112 - auVar87._12_4_;
              auVar155._0_4_ = fVar146 - auVar202._0_4_;
              auVar155._4_4_ = fVar111 - auVar202._4_4_;
              auVar155._8_4_ = fVar116 - auVar202._8_4_;
              auVar155._12_4_ = fVar112 - auVar202._12_4_;
              local_1218 = blendvps(auVar87,auVar138,local_11b8);
              local_1208 = blendvps(auVar202,auVar155,local_11b8);
              auVar103._8_4_ = valid.field_0.i[2];
              auVar103._0_8_ = valid.field_0._0_8_;
              auVar103._12_4_ = valid.field_0.i[3];
              auVar202 = blendvps(_DAT_01feb9f0,auVar214,auVar103);
              auVar156._4_4_ = auVar202._0_4_;
              auVar156._0_4_ = auVar202._4_4_;
              auVar156._8_4_ = auVar202._12_4_;
              auVar156._12_4_ = auVar202._8_4_;
              auVar87 = minps(auVar156,auVar202);
              auVar104._0_8_ = auVar87._8_8_;
              auVar104._8_4_ = auVar87._0_4_;
              auVar104._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar104,auVar87);
              auVar105._0_8_ =
                   CONCAT44(-(uint)(auVar87._4_4_ == auVar202._4_4_) & uVar117,
                            -(uint)(auVar87._0_4_ == auVar202._0_4_) & uVar50);
              auVar105._8_4_ = -(uint)(auVar87._8_4_ == auVar202._8_4_) & valid.field_0.i[2];
              auVar105._12_4_ = -(uint)(auVar87._12_4_ == auVar202._12_4_) & valid.field_0.i[3];
              iVar51 = movmskps(iVar51,auVar105);
              aVar126 = valid.field_0;
              if (iVar51 != 0) {
                aVar126.i[2] = auVar105._8_4_;
                aVar126._0_8_ = auVar105._0_8_;
                aVar126.i[3] = auVar105._12_4_;
              }
              uVar52 = movmskps(iVar51,(undefined1  [16])aVar126);
              lVar60 = 0;
              if (CONCAT44(uVar61,uVar52) != 0) {
                for (; (CONCAT44(uVar61,uVar52) >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
LAB_0029accd:
              uVar50 = *(uint *)(lVar65 + 0x40 + lVar60 * 4);
              pRVar54 = (RTCRayN *)(ulong)uVar50;
              pGVar26 = (pSVar24->geometries).items[(long)pRVar54].ptr;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar60] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar61 = *(undefined4 *)(local_1218 + lVar60 * 4);
                  uVar52 = *(undefined4 *)(local_1208 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11e8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11d8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11c8 + lVar60 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar61;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar52;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar65 + 0x50 + lVar60 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar50;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0029b132;
                }
                local_10c8 = *(undefined4 *)(local_1218 + lVar60 * 4);
                local_10b8 = *(undefined4 *)(local_1208 + lVar60 * 4);
                uVar61 = *(undefined4 *)(local_11e8 + lVar60 * 4);
                uVar52 = *(undefined4 *)(local_11d8 + lVar60 * 4);
                local_1098._4_4_ = uVar50;
                local_1098._0_4_ = uVar50;
                local_1098._8_4_ = uVar50;
                local_1098._12_4_ = uVar50;
                uVar21 = *(undefined4 *)(lVar65 + 0x50 + lVar60 * 4);
                local_10a8._4_4_ = uVar21;
                local_10a8._0_4_ = uVar21;
                local_10a8._8_4_ = uVar21;
                local_10a8._12_4_ = uVar21;
                local_10f8._4_4_ = uVar61;
                local_10f8._0_4_ = uVar61;
                local_10f8._8_4_ = uVar61;
                local_10f8._12_4_ = uVar61;
                local_10e8._4_4_ = uVar52;
                local_10e8._0_4_ = uVar52;
                local_10e8._8_4_ = uVar52;
                local_10e8._12_4_ = uVar52;
                local_10d8._4_4_ = *(undefined4 *)(local_11c8 + lVar60 * 4);
                local_10d8._0_4_ = local_10d8._4_4_;
                local_10d8._8_4_ = local_10d8._4_4_;
                local_10d8._12_4_ = local_10d8._4_4_;
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                uStack_10b4 = local_10b8;
                uStack_10b0 = local_10b8;
                uStack_10ac = local_10b8;
                local_1088 = context->user->instID[0];
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                local_1078 = context->user->instPrimID[0];
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11f8 + lVar60 * 4);
                local_1368 = *(undefined8 *)(mm_lookupmask_ps + lVar56);
                uStack_1360 = *(undefined8 *)(mm_lookupmask_ps + lVar56 + 8);
                args.valid = (int *)&local_1368;
                args.geometryUserPtr = pGVar26->userPtr;
                args.context = context->user;
                args.ray = (RTCRayN *)ray;
                args.hit = (RTCHitN *)local_10f8;
                args.N = 4;
                pRVar54 = (RTCRayN *)pGVar26->intersectionFilterN;
                if (pRVar54 != (RTCRayN *)0x0) {
                  pRVar54 = (RTCRayN *)(*(code *)pRVar54)(&args);
                }
                auVar46._8_8_ = uStack_1360;
                auVar46._0_8_ = local_1368;
                if (auVar46 == (undefined1  [16])0x0) {
                  auVar127._8_4_ = 0xffffffff;
                  auVar127._0_8_ = 0xffffffffffffffff;
                  auVar127._12_4_ = 0xffffffff;
                  auVar127 = auVar127 ^ _DAT_01febe20;
                }
                else {
                  pRVar54 = (RTCRayN *)context->args->filter;
                  if ((pRVar54 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar54 = (RTCRayN *)(*(code *)pRVar54)(&args);
                  }
                  auVar47._8_8_ = uStack_1360;
                  auVar47._0_8_ = local_1368;
                  auVar106._0_4_ = -(uint)((int)local_1368 == 0);
                  auVar106._4_4_ = -(uint)((int)((ulong)local_1368 >> 0x20) == 0);
                  auVar106._8_4_ = -(uint)((int)uStack_1360 == 0);
                  auVar106._12_4_ = -(uint)((int)((ulong)uStack_1360 >> 0x20) == 0);
                  auVar127 = auVar106 ^ _DAT_01febe20;
                  if (auVar47 != (undefined1  [16])0x0) {
                    auVar87 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar106);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar87;
                    pRVar54 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar127) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar61;
                }
                valid.field_0.v[lVar60] = 0.0;
                fVar116 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar214._4_4_ <= fVar116) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar214._0_4_ <= fVar116) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar214._8_4_ <= fVar116) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar214._12_4_ <= fVar116) & valid.field_0.i[3];
              }
              iVar51 = movmskps((int)pRVar54,(undefined1  [16])valid.field_0);
              if (iVar51 == 0) goto LAB_0029b132;
              auVar202 = blendvps(_DAT_01feb9f0,auVar214,(undefined1  [16])valid.field_0);
              auVar157._4_4_ = auVar202._0_4_;
              auVar157._0_4_ = auVar202._4_4_;
              auVar157._8_4_ = auVar202._12_4_;
              auVar157._12_4_ = auVar202._8_4_;
              auVar87 = minps(auVar157,auVar202);
              auVar128._0_8_ = auVar87._8_8_;
              auVar128._8_4_ = auVar87._0_4_;
              auVar128._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar128,auVar87);
              auVar129._0_8_ =
                   CONCAT44(-(uint)(auVar87._4_4_ == auVar202._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar87._0_4_ == auVar202._0_4_) & valid.field_0._0_4_);
              auVar129._8_4_ = -(uint)(auVar87._8_4_ == auVar202._8_4_) & valid.field_0._8_4_;
              auVar129._12_4_ = -(uint)(auVar87._12_4_ == auVar202._12_4_) & valid.field_0._12_4_;
              iVar51 = movmskps(iVar51,auVar129);
              aVar107 = valid.field_0;
              if (iVar51 != 0) {
                aVar107.i[2] = auVar129._8_4_;
                aVar107._0_8_ = auVar129._0_8_;
                aVar107.i[3] = auVar129._12_4_;
              }
              uVar61 = movmskps(iVar51,(undefined1  [16])aVar107);
              uVar55 = CONCAT44((int)((ulong)pRVar54 >> 0x20),uVar61);
              lVar60 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                }
              }
              goto LAB_0029accd;
            }
          }
        }
LAB_0029b132:
        local_1120 = local_1120 + 1;
        sVar66 = k;
        pRVar73 = ray;
      } while (local_1120 != local_1140);
    }
    uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar202._4_4_ = uVar61;
    auVar202._0_4_ = uVar61;
    auVar202._8_4_ = uVar61;
    auVar202._12_4_ = uVar61;
    uVar67 = local_1160;
    uVar55 = local_1178;
    uVar57 = local_1170;
    uVar58 = local_1168;
    auVar87 = local_1118;
    fVar116 = local_1008;
    fVar246 = fStack_1004;
    fVar196 = fStack_1000;
    fVar144 = fStack_ffc;
    fVar252 = local_1038;
    fVar146 = fStack_1034;
    fVar111 = fStack_1030;
    fVar112 = fStack_102c;
    fVar114 = local_1048;
    fVar115 = fStack_1044;
    fVar159 = fStack_1040;
    fVar167 = fStack_103c;
    fVar161 = local_1068;
    fVar179 = fStack_1064;
    fVar163 = fStack_1060;
    fVar186 = fStack_105c;
    fVar147 = local_1108;
    fVar194 = fStack_1104;
    fVar198 = fStack_1100;
    fVar207 = fStack_10fc;
    fVar209 = local_ff8;
    fVar211 = fStack_ff4;
    fVar212 = fStack_ff0;
    fVar215 = fStack_fec;
    fVar216 = local_1018;
    fVar217 = fStack_1014;
    fVar221 = fStack_1010;
    fVar222 = fStack_100c;
    fVar76 = local_1028;
    fVar77 = fStack_1024;
    fVar108 = fStack_1020;
    fVar109 = fStack_101c;
    fVar110 = local_1058;
    fVar113 = fStack_1054;
    fVar132 = fStack_1050;
    fVar131 = fStack_104c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }